

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_mul op;
  int local_1d4;
  undefined8 *local_1c0;
  undefined8 *local_1b0;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined4 uStack_64;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  local_1d4 = 0;
  fVar1 = *in_RSI;
  auVar2 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x30);
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
  local_1c0 = in_RDX;
  local_1b0 = in_RDI;
  for (; local_1d4 + 7 < in_ECX * in_R8D; local_1d4 = local_1d4 + 8) {
    local_80 = (float)*local_1b0;
    fStack_7c = (float)((ulong)*local_1b0 >> 0x20);
    fStack_78 = (float)local_1b0[1];
    fStack_74 = (float)((ulong)local_1b0[1] >> 0x20);
    fStack_70 = (float)local_1b0[2];
    fStack_6c = (float)((ulong)local_1b0[2] >> 0x20);
    fStack_68 = (float)local_1b0[3];
    uStack_64 = (undefined4)((ulong)local_1b0[3] >> 0x20);
    local_a0 = auVar3._0_4_;
    fStack_9c = auVar3._4_4_;
    fStack_98 = auVar3._8_4_;
    fStack_94 = auVar3._12_4_;
    fStack_90 = auVar2._0_4_;
    fStack_8c = auVar2._4_4_;
    fStack_88 = auVar2._8_4_;
    *local_1c0 = CONCAT44(fStack_7c * fStack_9c,local_80 * local_a0);
    local_1c0[1] = CONCAT44(fStack_74 * fStack_94,fStack_78 * fStack_98);
    local_1c0[2] = CONCAT44(fStack_6c * fStack_8c,fStack_70 * fStack_90);
    local_1c0[3] = CONCAT44(uStack_64,fStack_68 * fStack_88);
    local_1b0 = local_1b0 + 4;
    local_1c0 = local_1c0 + 4;
  }
  fVar1 = *in_RSI;
  for (; local_1d4 + 3 < in_ECX * in_R8D; local_1d4 = local_1d4 + 4) {
    local_40 = (float)*local_1b0;
    fStack_3c = (float)((ulong)*local_1b0 >> 0x20);
    fStack_38 = (float)local_1b0[1];
    fStack_34 = (float)((ulong)local_1b0[1] >> 0x20);
    *local_1c0 = CONCAT44(fStack_3c * fVar1,local_40 * fVar1);
    local_1c0[1] = CONCAT44(fStack_34 * fVar1,fStack_38 * fVar1);
    local_1b0 = local_1b0 + 2;
    local_1c0 = local_1c0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}